

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

void __thiscall
qpdf::BaseDictionary::replaceKey(BaseDictionary *this,string *key,QPDFObjectHandle *value)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_01;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             *)dict(this);
  bVar1 = QPDFObjectHandle::isNull(value);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isIndirect(value);
    if (!bVar1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::erase(this_00,key);
      return;
    }
  }
  this_01 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          *)this_00,key);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
  return;
}

Assistant:

void
BaseDictionary::replaceKey(std::string const& key, QPDFObjectHandle value)
{
    auto d = dict();
    if (value.isNull() && !value.isIndirect()) {
        // The PDF spec doesn't distinguish between keys with null values and missing keys.
        // Allow indirect nulls which are equivalent to a dangling reference, which is
        // permitted by the spec.
        d->items.erase(key);
    } else {
        // add or replace value
        d->items[key] = value;
    }
}